

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong mkvparser::ReadID(IMkvReader *pReader,longlong pos,long *len)

{
  bool bVar1;
  int iVar2;
  int local_54;
  IMkvReader *pIStack_50;
  int i;
  longlong ebml_id;
  int id_length;
  bool found_bit;
  int kCheckByte;
  int kMaxIdLengthInBytes;
  int bit_pos;
  int read_status;
  uchar temp_byte;
  long *len_local;
  longlong pos_local;
  IMkvReader *pReader_local;
  
  if ((pReader == (IMkvReader *)0x0) || (pos < 0)) {
    pReader_local = (IMkvReader *)0xfffffffffffffffe;
  }
  else {
    bit_pos._3_1_ = 0;
    _read_status = len;
    len_local = (long *)pos;
    pos_local = (longlong)pReader;
    iVar2 = (**pReader->_vptr_IMkvReader)(pReader,pos,1,(long)&bit_pos + 3);
    if (iVar2 < 0) {
      pReader_local = (IMkvReader *)0xfffffffffffffffe;
    }
    else if (iVar2 < 1) {
      if (bit_pos._3_1_ == 0) {
        pReader_local = (IMkvReader *)0xfffffffffffffffe;
      }
      else {
        bVar1 = false;
        for (kCheckByte = 0; kCheckByte < 4; kCheckByte = kCheckByte + 1) {
          if ((0x80 >> ((byte)kCheckByte & 0x1f) & (uint)bit_pos._3_1_) != 0) {
            bVar1 = true;
            break;
          }
        }
        if (bVar1) {
          pIStack_50 = (IMkvReader *)(ulong)bit_pos._3_1_;
          for (local_54 = 1; local_54 < kCheckByte + 1; local_54 = local_54 + 1) {
            iVar2 = (*(code *)**(undefined8 **)pos_local)
                              (pos_local,(long)len_local + (long)local_54,1,(long)&bit_pos + 3);
            if (iVar2 < 0) {
              return -2;
            }
            if (0 < iVar2) {
              return -3;
            }
            pIStack_50 = (IMkvReader *)((ulong)bit_pos._3_1_ | (long)pIStack_50 << 8);
          }
          *_read_status = (long)(kCheckByte + 1);
          pReader_local = pIStack_50;
        }
        else {
          pReader_local = (IMkvReader *)0xfffffffffffffffe;
        }
      }
    }
    else {
      pReader_local = (IMkvReader *)0xfffffffffffffffd;
    }
  }
  return (longlong)pReader_local;
}

Assistant:

long long ReadID(IMkvReader* pReader, long long pos, long& len) {
  if (pReader == NULL || pos < 0)
    return E_FILE_FORMAT_INVALID;

  // Read the first byte. The length in bytes of the ID is determined by
  // finding the first set bit in the first byte of the ID.
  unsigned char temp_byte = 0;
  int read_status = pReader->Read(pos, 1, &temp_byte);

  if (read_status < 0)
    return E_FILE_FORMAT_INVALID;
  else if (read_status > 0)  // No data to read.
    return E_BUFFER_NOT_FULL;

  if (temp_byte == 0)  // ID length > 8 bytes; invalid file.
    return E_FILE_FORMAT_INVALID;

  int bit_pos = 0;
  const int kMaxIdLengthInBytes = 4;
  const int kCheckByte = 0x80;

  // Find the first bit that's set.
  bool found_bit = false;
  for (; bit_pos < kMaxIdLengthInBytes; ++bit_pos) {
    if ((kCheckByte >> bit_pos) & temp_byte) {
      found_bit = true;
      break;
    }
  }

  if (!found_bit) {
    // The value is too large to be a valid ID.
    return E_FILE_FORMAT_INVALID;
  }

  // Read the remaining bytes of the ID (if any).
  const int id_length = bit_pos + 1;
  long long ebml_id = temp_byte;
  for (int i = 1; i < id_length; ++i) {
    ebml_id <<= 8;
    read_status = pReader->Read(pos + i, 1, &temp_byte);

    if (read_status < 0)
      return E_FILE_FORMAT_INVALID;
    else if (read_status > 0)
      return E_BUFFER_NOT_FULL;

    ebml_id |= temp_byte;
  }

  len = id_length;
  return ebml_id;
}